

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O0

void __thiscall
Fl_Xlib_Graphics_Driver::font(Fl_Xlib_Graphics_Driver *this,Fl_Font fnum,Fl_Fontsize size)

{
  Fl_Font FVar1;
  Fl_Fontsize FVar2;
  Fl_Font_Descriptor *d;
  Fl_Font_Descriptor *pFVar3;
  Fl_Font_Descriptor *f;
  Fl_Fontsize size_local;
  Fl_Font fnum_local;
  Fl_Xlib_Graphics_Driver *this_local;
  
  if (fnum == -1) {
    Fl_Graphics_Driver::font(&this->super_Fl_Graphics_Driver,0,0);
  }
  else {
    FVar1 = Fl_Graphics_Driver::font(&this->super_Fl_Graphics_Driver);
    if ((fnum != FVar1) ||
       (FVar2 = Fl_Graphics_Driver::size(&this->super_Fl_Graphics_Driver), size != FVar2)) {
      Fl_Graphics_Driver::font(&this->super_Fl_Graphics_Driver,fnum,size);
      d = find(fnum,size);
      pFVar3 = Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver);
      if (d != pFVar3) {
        Fl_Graphics_Driver::font_descriptor(&this->super_Fl_Graphics_Driver,d);
        Fl_XFont_On_Demand::operator=(&fl_xfont,*d->font->fonts);
        font_gc = (GC)0x0;
      }
    }
  }
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::font(Fl_Font fnum, Fl_Fontsize size) {
  if (fnum==-1) {
    Fl_Graphics_Driver::font(0, 0);
    return;
  }
  if (fnum == Fl_Graphics_Driver::font() && size == Fl_Graphics_Driver::size()) return;
  Fl_Graphics_Driver::font(fnum, size);
  Fl_Font_Descriptor* f = find(fnum, size);
  if (f != this->font_descriptor()) {
    this->font_descriptor(f);
    fl_xfont = f->font->fonts[0];
    font_gc = 0;
  }
}